

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

void memleak_free(void *addr,char *file,size_t line)

{
  avl_node *paVar1;
  void *in_RDI;
  memleak_item query;
  memleak_item *item;
  avl_node *a;
  avl_cmp_func *in_stack_ffffffffffffffa8;
  avl_node *in_stack_ffffffffffffffb0;
  avl_tree *in_stack_ffffffffffffffb8;
  avl_node *in_stack_ffffffffffffffc8;
  avl_tree *in_stack_ffffffffffffffd0;
  
  if (start_sw != '\0') {
    pthread_spin_lock(&lock);
    paVar1 = avl_search(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (paVar1 == (avl_node *)0x0) {
      pthread_spin_unlock(&lock);
      return;
    }
    memset(in_RDI,0xff,(size_t)paVar1[-1].left);
    avl_remove(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    free(&paVar1[-2].right);
    pthread_spin_unlock(&lock);
  }
  free(in_RDI);
  return;
}

Assistant:

LIBMEMLEAK_API
void memleak_free(void *addr, char *file, size_t line)
{
    struct avl_node *a;
    struct memleak_item *item, query;

    if (start_sw) {
        spin_lock(&lock);

        query.addr = (uint64_t)addr;
        a = avl_search(&tree_index, &query.avl, memleak_cmp);
        if (!a) {
#ifdef _WARN_NOT_ALLOCATED_MEMORY
            fprintf(stderr, "try to free not allocated memory address 0x%016lx at %s:%ld\n",
                (long unsigned int)addr, file, line);
#endif
            spin_unlock(&lock);
            return;
        }

        item = _get_entry(a, struct memleak_item, avl);
        DBG("free address 0x%016lx (allocated at %s:%ld, size %ld)\n",
            item->addr, item->file, item->line, item->size);
#ifdef FREE_VAL
        memset(addr, FREE_VAL, item->size);
#endif

#ifdef _STACK_BACKTRACE
        free(item->btrace);
#endif

#ifndef _CHK_MODIFY_AFTER_FREE
        avl_remove(&tree_index, a);
        free(item);
#else
        item->freed = 1;
#endif
        spin_unlock(&lock);
    }
#ifndef _CHK_MODIFY_AFTER_FREE
    free(addr);
#endif
}